

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O2

int fts5DecodeDoclist(int *pRc,Fts5Buffer *pBuf,u8 *a,int n)

{
  uint uVar1;
  byte bVar2;
  int iVar3;
  uint uVar4;
  ulong in_RAX;
  ulong extraout_RAX;
  char *pcVar5;
  int bDel;
  int nPos;
  i64 iDelta;
  int local_48;
  uint local_44;
  u64 local_40 [2];
  
  local_40[1] = 0;
  if (n < 1) {
    uVar4 = 0;
    goto LAB_001c0241;
  }
  bVar2 = sqlite3Fts5GetVarint(a,local_40 + 1);
  uVar4 = (uint)bVar2;
  do {
    sqlite3Fts5BufferAppendPrintf(pRc,pBuf," id=%lld");
    in_RAX = extraout_RAX;
LAB_001c0241:
    do {
      if (n <= (int)uVar4) {
        return (int)in_RAX;
      }
      iVar3 = fts5GetPoslistSize(a + (int)uVar4,(int *)&local_44,&local_48);
      uVar1 = local_44;
      iVar3 = iVar3 + uVar4;
      pcVar5 = "*";
      if (local_48 == 0) {
        pcVar5 = "";
      }
      sqlite3Fts5BufferAppendPrintf(pRc,pBuf," nPos=%d%s",(ulong)local_44,pcVar5);
      uVar4 = n - iVar3;
      if ((int)uVar1 <= n - iVar3) {
        uVar4 = uVar1;
      }
      uVar4 = fts5DecodePoslist(pRc,pBuf,a + iVar3,uVar4);
      in_RAX = (ulong)uVar4;
      uVar4 = uVar4 + iVar3;
    } while (n <= (int)uVar4);
    bVar2 = sqlite3Fts5GetVarint(a + (int)uVar4,local_40);
    uVar4 = uVar4 + bVar2;
  } while( true );
}

Assistant:

static int fts5DecodeDoclist(int *pRc, Fts5Buffer *pBuf, const u8 *a, int n){
  i64 iDocid = 0;
  int iOff = 0;

  if( n>0 ){
    iOff = sqlite3Fts5GetVarint(a, (u64*)&iDocid);
    sqlite3Fts5BufferAppendPrintf(pRc, pBuf, " id=%lld", iDocid);
  }
  while( iOff<n ){
    int nPos;
    int bDel;
    iOff += fts5GetPoslistSize(&a[iOff], &nPos, &bDel);
    sqlite3Fts5BufferAppendPrintf(pRc, pBuf, " nPos=%d%s", nPos, bDel?"*":"");
    iOff += fts5DecodePoslist(pRc, pBuf, &a[iOff], MIN(n-iOff, nPos));
    if( iOff<n ){
      i64 iDelta;
      iOff += sqlite3Fts5GetVarint(&a[iOff], (u64*)&iDelta);
      iDocid += iDelta;
      sqlite3Fts5BufferAppendPrintf(pRc, pBuf, " id=%lld", iDocid);
    }
  }

  return iOff;
}